

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.cpp
# Opt level: O0

CBString * sectionTypeToUString(CBString *__return_storage_ptr__,UINT8 type)

{
  UINT8 type_local;
  
  if (type == '\x01') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Compressed");
  }
  else if (type == '\x02') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"GUID defined");
  }
  else if (type == '\x03') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Disposable");
  }
  else if (type == '\x10') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"PE32 image");
  }
  else if (type == '\x11') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"PIC image");
  }
  else if (type == '\x12') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"TE image");
  }
  else if (type == '\x13') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"DXE dependency");
  }
  else if (type == '\x14') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Version");
  }
  else if (type == '\x15') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"UI");
  }
  else if (type == '\x16') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"16-bit image");
  }
  else if (type == '\x17') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Volume image");
  }
  else if (type == '\x18') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Freeform subtype GUID");
  }
  else if (type == '\x19') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Raw");
  }
  else if (type == '\x1b') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"PEI dependency");
  }
  else if (type == '\x1c') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"MM dependency");
  }
  else if (type == ' ') {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Insyde postcode");
  }
  else if (type == 0xf0) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"Phoenix postcode");
  }
  else {
    usprintf(__return_storage_ptr__,"Unknown %02Xh",(ulong)type);
  }
  return __return_storage_ptr__;
}

Assistant:

UString sectionTypeToUString(const UINT8 type)
{
    switch (type) {
        case EFI_SECTION_COMPRESSION:               return UString("Compressed");
        case EFI_SECTION_GUID_DEFINED:              return UString("GUID defined");
        case EFI_SECTION_DISPOSABLE:                return UString("Disposable");
        case EFI_SECTION_PE32:                      return UString("PE32 image");
        case EFI_SECTION_PIC:                       return UString("PIC image");
        case EFI_SECTION_TE:                        return UString("TE image");
        case EFI_SECTION_DXE_DEPEX:                 return UString("DXE dependency");
        case EFI_SECTION_VERSION:                   return UString("Version");
        case EFI_SECTION_USER_INTERFACE:            return UString("UI");
        case EFI_SECTION_COMPATIBILITY16:           return UString("16-bit image");
        case EFI_SECTION_FIRMWARE_VOLUME_IMAGE:     return UString("Volume image");
        case EFI_SECTION_FREEFORM_SUBTYPE_GUID:     return UString("Freeform subtype GUID");
        case EFI_SECTION_RAW:                       return UString("Raw");
        case EFI_SECTION_PEI_DEPEX:                 return UString("PEI dependency");
        case EFI_SECTION_MM_DEPEX:                  return UString("MM dependency");
        case INSYDE_SECTION_POSTCODE:               return UString("Insyde postcode");
        case PHOENIX_SECTION_POSTCODE:              return UString("Phoenix postcode");
    }
    return usprintf("Unknown %02Xh", type);
}